

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cc
# Opt level: O0

string * sutil::trim(string *__return_storage_ptr__,string *s)

{
  long lVar1;
  char cVar2;
  string *s_local;
  string *str;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  lVar1 = std::__cxx11::string::size();
  std::__cxx11::string::replace((ulong)__return_storage_ptr__,0,lVar1 - 1,'\n');
  cVar2 = (char)__return_storage_ptr__;
  std::__cxx11::string::find_first_not_of(cVar2,0x20);
  std::__cxx11::string::erase((ulong)__return_storage_ptr__,0);
  lVar1 = std::__cxx11::string::find_last_not_of(cVar2,0x20);
  std::__cxx11::string::size();
  std::__cxx11::string::erase((ulong)__return_storage_ptr__,lVar1 + 1);
  std::__cxx11::string::find_first_not_of(cVar2,9);
  std::__cxx11::string::erase((ulong)__return_storage_ptr__,0);
  lVar1 = std::__cxx11::string::find_last_not_of(cVar2,9);
  std::__cxx11::string::size();
  std::__cxx11::string::erase((ulong)__return_storage_ptr__,lVar1 + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string sutil::trim(const std::string &s) {
    std::string str = s;
    str.replace(0, str.size() - 1, '\n', ' ');
    str.erase(0, str.find_first_not_of(' '));
    str.erase(str.find_last_not_of(' ') + 1, str.size());
    str.erase(0, str.find_first_not_of('\t'));
    str.erase(str.find_last_not_of('\t') + 1, str.size());
    return str;
}